

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

void gc_traverse_trace(global_State *g,GCtrace *T)

{
  IRIns *pIVar1;
  ulong uVar2;
  GCobj *o;
  uint uVar3;
  uint uVar4;
  
  if (T->traceno != 0) {
    uVar3 = T->nk;
    if (uVar3 < 0x7ffd) {
      do {
        pIVar1 = T->ir;
        uVar2 = (ulong)uVar3;
        if ((*(char *)((long)pIVar1 + uVar2 * 8 + 5) == '\x18') &&
           (((((GCobj *)(ulong)pIVar1[uVar2].field_1.op12)->gch).marked & 3) != 0)) {
          gc_mark(g,(GCobj *)(ulong)pIVar1[uVar2].field_1.op12);
        }
        uVar4 = uVar3;
        if ((0x604208U >> (*(uint *)((long)pIVar1 + uVar2 * 8 + 4) & 0x1f) & 1) != 0) {
          uVar4 = uVar3 + (*(char *)((long)pIVar1 + uVar2 * 8 + 5) != '\x1b');
        }
        uVar3 = uVar4 + 1;
      } while (uVar4 < 0x7ffc);
    }
    if ((ulong)T->link != 0) {
      uVar3 = *(uint *)(g[1].wrapf + (ulong)T->link * 4);
      uVar2 = (ulong)uVar3;
      if ((*(byte *)(uVar2 + 4) & 3) != 0) {
        *(byte *)(uVar2 + 4) = *(byte *)(uVar2 + 4) & 0xfc;
        *(uint32_t *)(uVar2 + 0xc) = (g->gc).gray.gcptr32;
        (g->gc).gray.gcptr32 = uVar3;
      }
    }
    if ((ulong)T->nextroot != 0) {
      uVar3 = *(uint *)(g[1].wrapf + (ulong)T->nextroot * 4);
      uVar2 = (ulong)uVar3;
      if ((*(byte *)(uVar2 + 4) & 3) != 0) {
        *(byte *)(uVar2 + 4) = *(byte *)(uVar2 + 4) & 0xfc;
        *(uint32_t *)(uVar2 + 0xc) = (g->gc).gray.gcptr32;
        (g->gc).gray.gcptr32 = uVar3;
      }
    }
    if ((ulong)T->nextside != 0) {
      uVar3 = *(uint *)(g[1].wrapf + (ulong)T->nextside * 4);
      uVar2 = (ulong)uVar3;
      if ((*(byte *)(uVar2 + 4) & 3) != 0) {
        *(byte *)(uVar2 + 4) = *(byte *)(uVar2 + 4) & 0xfc;
        *(uint32_t *)(uVar2 + 0xc) = (g->gc).gray.gcptr32;
        (g->gc).gray.gcptr32 = uVar3;
      }
    }
    o = (GCobj *)(ulong)(T->startpt).gcptr32;
    if (((o->gch).marked & 3) != 0) {
      gc_mark(g,o);
      return;
    }
  }
  return;
}

Assistant:

static void gc_traverse_trace(global_State *g, GCtrace *T)
{
  IRRef ref;
  if (T->traceno == 0) return;
  for (ref = T->nk; ref < REF_TRUE; ref++) {
    IRIns *ir = &T->ir[ref];
    if (ir->o == IR_KGC)
      gc_markobj(g, ir_kgc(ir));
    if (irt_is64(ir->t) && ir->o != IR_KNULL)
      ref++;
  }
  if (T->link) gc_marktrace(g, T->link);
  if (T->nextroot) gc_marktrace(g, T->nextroot);
  if (T->nextside) gc_marktrace(g, T->nextside);
  gc_markobj(g, gcref(T->startpt));
}